

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O0

double esum(int *mu,double *x)

{
  double dVar1;
  double dVar2;
  double *x_local;
  int *mu_local;
  
  if (*x <= 0.0) {
    if ((-1 < *mu) && (esum::w = (double)*mu + *x, esum::w <= 0.0)) {
      esum::esum = exp(esum::w);
      return esum::esum;
    }
  }
  else if ((*mu < 1) && (esum::w = (double)*mu + *x, 0.0 <= esum::w)) {
    esum::esum = exp(esum::w);
    return esum::esum;
  }
  esum::w = (double)*mu;
  dVar1 = exp(esum::w);
  dVar2 = exp(*x);
  mu_local = (int *)(dVar1 * dVar2);
  esum::esum = (double)mu_local;
  return (double)(int *)(dVar1 * dVar2);
}

Assistant:

double esum(int *mu,double *x)
/*
-----------------------------------------------------------------------
                    EVALUATION OF EXP(MU + X)
-----------------------------------------------------------------------
*/
{
static double esum,w;
/*
     ..
     .. Executable Statements ..
*/
    if(*x > 0.0e0) goto S10;
    if(*mu < 0) goto S20;
    w = (double)*mu+*x;
    if(w > 0.0e0) goto S20;
    esum = exp(w);
    return esum;
S10:
    if(*mu > 0) goto S20;
    w = (double)*mu+*x;
    if(w < 0.0e0) goto S20;
    esum = exp(w);
    return esum;
S20:
    w = *mu;
    esum = exp(w)*exp(*x);
    return esum;
}